

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Matcher::RunContStack
          (Matcher *this,Char *input,CharCount *inputOffset,uint8 **instPointer,ContStack *contStack
          ,AssertionStack *assertionStack,uint *qcTicks)

{
  RepeatLoopCont *this_00;
  LoopInfo *pLVar1;
  int iVar2;
  code *pcVar3;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar4;
  size_t sVar5;
  bool bVar6;
  byte bVar7;
  size_t *psVar8;
  undefined4 *puVar9;
  Program *pPVar10;
  int i;
  uint uVar11;
  
  PopStats(this,contStack,input);
  psVar8 = (size_t *)
           ContinuousPageStack<1UL>::Pop
                     ((ContinuousPageStack<1UL> *)contStack,
                      (contStack->
                      super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                      topElementSize);
  if (psVar8 != (size_t *)0x0) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = *psVar8;
      bVar7 = (byte)psVar8[2];
      if (10 < bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x13d3,"(cont->tag >= minContTag && cont->tag <= maxContTag)",
                           "cont->tag >= minContTag && cont->tag <= maxContTag");
        if (!bVar6) goto LAB_00eec3e9;
        *puVar9 = 0;
        bVar7 = (byte)psVar8[2];
      }
      if (10 < bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0x13dc,"(false)","false");
        if (bVar6) {
          *puVar9 = 0;
          return false;
        }
LAB_00eec3e9:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      this_00 = (RepeatLoopCont *)(psVar8 + 1);
      switch(bVar7) {
      case 0:
        *inputOffset = *(CharCount *)((long)psVar8 + 0x14);
        sVar5 = psVar8[3];
        pPVar10 = (this->program).ptr;
        if ((pPVar10->rep).insts.instsLen <= (uint)sVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                             ,0x76d,"(label < program->rep.insts.instsLen)",
                             "label < program->rep.insts.instsLen");
          if (!bVar6) goto LAB_00eec3e9;
          *puVar9 = 0;
          pPVar10 = (this->program).ptr;
        }
        *instPointer = (pPVar10->rep).insts.insts.ptr + (uint)sVar5;
        return false;
      case 1:
        QueryContinue(this,qcTicks);
        iVar2 = *(int *)((long)psVar8 + 0x14);
        if (((long)iVar2 < 0) || (((this->program).ptr)->numLoops <= iVar2)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                             ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                             "loopId >= 0 && loopId < program->numLoops");
          if (!bVar6) goto LAB_00eec3e9;
          *puVar9 = 0;
        }
        sVar5 = psVar8[3];
        pLVar4 = (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  *)psVar8[4];
        pLVar1 = (this->loopInfos).ptr + iVar2;
        pLVar1->number = (int)sVar5;
        pLVar1->startInputOffset = (int)(sVar5 >> 0x20);
        pLVar1->offsetsOfFollowFirst = pLVar4;
        goto LAB_00eec304;
      case 2:
        uVar11 = *(uint *)((long)psVar8 + 0x14);
        if (((long)(int)uVar11 < 0) || (((this->program).ptr)->numGroups <= uVar11)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                             ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                             "groupId >= 0 && groupId < program->numGroups");
          if (!bVar6) goto LAB_00eec3e9;
          *puVar9 = 0;
        }
        (this->groupInfos).ptr[(int)uVar11] = *(GroupInfo *)(psVar8 + 3);
        goto LAB_00eec304;
      case 3:
        uVar11 = *(uint *)((long)psVar8 + 0x14);
        if (((long)(int)uVar11 < 0) || (((this->program).ptr)->numGroups <= uVar11)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                             ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                             "groupId >= 0 && groupId < program->numGroups");
          if (!bVar6) goto LAB_00eec3e9;
          *puVar9 = 0;
        }
        (this->groupInfos).ptr[(int)uVar11].length = 0xffffffff;
        goto LAB_00eec304;
      case 4:
        sVar5 = psVar8[3];
        for (uVar11 = *(uint *)((long)psVar8 + 0x14); (int)uVar11 <= (int)sVar5; uVar11 = uVar11 + 1
            ) {
          if (((int)uVar11 < 0) || (((this->program).ptr)->numGroups <= uVar11)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar9 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                               ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                               "groupId >= 0 && groupId < program->numGroups");
            if (!bVar6) goto LAB_00eec3e9;
            *puVar9 = 0;
          }
          (this->groupInfos).ptr[(int)uVar11].length = 0xffffffff;
        }
        goto LAB_00eec304;
      case 5:
        bVar6 = RepeatLoopCont::Exec
                          (this_00,this,input,inputOffset,instPointer,contStack,assertionStack,
                           qcTicks);
        break;
      case 6:
        if ((assertionStack->
            super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0x1221,"(!assertionStack.IsEmpty())","!assertionStack.IsEmpty()");
          if (!bVar6) goto LAB_00eec3e9;
          *puVar9 = 0;
        }
        bVar6 = PopAssertion(this,inputOffset,instPointer,contStack,assertionStack,false);
        break;
      case 7:
        bVar6 = RewindLoopFixedCont::Exec
                          ((RewindLoopFixedCont *)this_00,this,input,inputOffset,instPointer,
                           contStack,assertionStack,qcTicks);
        break;
      case 8:
        bVar6 = RewindLoopSetCont::Exec
                          ((RewindLoopSetCont *)this_00,this,input,inputOffset,instPointer,contStack
                           ,assertionStack,qcTicks);
        break;
      case 9:
        bVar6 = RewindLoopSetWithFollowFirstCont::Exec
                          ((RewindLoopSetWithFollowFirstCont *)this_00,this,input,inputOffset,
                           instPointer,contStack,assertionStack,qcTicks);
        break;
      case 10:
        bVar6 = RewindLoopFixedGroupLastIterationCont::Exec
                          ((RewindLoopFixedGroupLastIterationCont *)this_00,this,input,inputOffset,
                           instPointer,contStack,assertionStack,qcTicks);
      }
      if (bVar6 != false) {
        return false;
      }
LAB_00eec304:
      PopStats(this,contStack,input);
      psVar8 = (size_t *)
               ContinuousPageStack<1UL>::Pop
                         ((ContinuousPageStack<1UL> *)contStack,
                          (contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                          topElementSize);
    } while (psVar8 != (size_t *)0x0);
  }
  return true;
}

Assistant:

inline bool Matcher::RunContStack(const Char* const input, CharCount &inputOffset, const uint8 *&instPointer, ContStack &contStack, AssertionStack &assertionStack, uint &qcTicks)
    {
        while (true)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            PopStats(contStack, input);
#endif
            Cont* cont = contStack.Pop();
            if (cont == 0)
            {
                break;
            }

            Assert(cont->tag >= minContTag && cont->tag <= maxContTag);
            // All these cases RESUME EXECUTION if backtracking finds a stop point
            const Cont::ContTag tag = cont->tag;
            switch (tag)
            {
#define M(O) case Cont::ContTag::O: if (((O##Cont*)cont)->Exec(*this, input, inputOffset, instPointer, contStack, assertionStack, qcTicks)) return false; break;
#include "RegexContcodes.h"
#undef M
            default:
                Assert(false); // should never be reached
                return false;  // however, can't use complier optimization if we wnat to return false here
            }
        }
        return true;
    }